

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O3

void __thiscall HEkk::timeReporting(HEkk *this,HighsInt save_mod_recover)

{
  HighsInt *pHVar1;
  bool bVar2;
  bool log_to_console;
  bool output_flag;
  SimplexTimer simplex_timer;
  HighsInt log_dev_level;
  bool local_6f;
  bool local_6e;
  SimplexTimer local_6d;
  HighsInt local_6c;
  HighsLogOptions local_68;
  
  if (save_mod_recover == 0) {
    if ((timeReporting::highs_analysis_level & 8U) == 0) {
      pHVar1 = &(this->options_->super_HighsOptionsStruct).highs_analysis_level;
      *pHVar1 = *pHVar1 + 8;
    }
  }
  else if (save_mod_recover == -1) {
    timeReporting::highs_analysis_level =
         (this->options_->super_HighsOptionsStruct).highs_analysis_level;
  }
  else {
    (this->options_->super_HighsOptionsStruct).highs_analysis_level =
         timeReporting::highs_analysis_level;
    bVar2 = SimplexTimer::reportSimplexInnerClock
                      (&local_6d,
                       (this->analysis_).thread_simplex_clocks.
                       super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl
                       .super__Vector_impl_data._M_start,20.0);
    (this->analysis_).analyse_simplex_time =
         (bool)((byte)(this->options_->super_HighsOptionsStruct).highs_analysis_level >> 3 & 1);
    if (bVar2) {
      local_68.user_callback_data._0_1_ = 0;
      local_68._81_8_ = 0;
      local_68.user_callback.super__Function_base._M_manager = (_Manager_type)0x0;
      local_68.user_callback._M_invoker._0_1_ = 0;
      local_68.user_callback._M_invoker._1_7_ = 0;
      local_68.user_callback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      local_68.user_callback.super__Function_base._M_functor._8_8_ = 0;
      local_68.user_log_callback = (_func_void_HighsLogType_char_ptr_void_ptr *)0x0;
      local_68.user_log_callback_data = (void *)0x0;
      local_68.output_flag = &local_6e;
      local_6e = true;
      local_68.log_to_console = &local_6f;
      local_6f = false;
      local_68.log_dev_level = &local_6c;
      local_6c = 3;
      local_68.log_stream = _stdout;
      reportSimplexPhaseIterations(&local_68,this->iteration_count_,&this->info_,false);
      if (local_68.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.user_callback.super__Function_base._M_manager)
                  ((_Any_data *)&local_68.user_callback,(_Any_data *)&local_68.user_callback,
                   __destroy_functor);
      }
    }
  }
  return;
}

Assistant:

void HEkk::timeReporting(const HighsInt save_mod_recover) {
  static HighsInt highs_analysis_level;
  if (save_mod_recover == -1) {
    highs_analysis_level = options_->highs_analysis_level;
  } else if (save_mod_recover == 0) {
    // Ensure that kHighsAnalysisLevelSolverTime is set
    if (!(kHighsAnalysisLevelSolverTime & highs_analysis_level))
      this->options_->highs_analysis_level += kHighsAnalysisLevelSolverTime;
  } else {
    options_->highs_analysis_level = highs_analysis_level;
    SimplexTimer simplex_timer;
    const bool non_null_report = simplex_timer.reportSimplexInnerClock(
        this->analysis_.thread_simplex_clocks[0], 20);
    this->analysis_.analyse_simplex_time =
        kHighsAnalysisLevelSolverTime & options_->highs_analysis_level;
    if (non_null_report) {
      HighsLogOptions log_options;
      bool output_flag = true;
      bool log_to_console = false;
      HighsInt log_dev_level = kHighsLogDevLevelVerbose;
      log_options.log_stream = stdout;
      log_options.output_flag = &output_flag;
      log_options.log_to_console = &log_to_console;
      log_options.log_dev_level = &log_dev_level;
      reportSimplexPhaseIterations(log_options, this->iteration_count_,
                                   this->info_);
    }
  }
}